

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O0

curltime cf_get_max_baller_time(Curl_cfilter *cf,Curl_easy *data,int query)

{
  long *plVar1;
  int iVar2;
  timediff_t tVar3;
  curltime cVar4;
  curltime older;
  curltime newer;
  Curl_cfilter *cfb;
  size_t i;
  curltime t;
  cf_hc_ctx *ctx;
  int query_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  curltime tmax;
  
  t._8_8_ = cf->ctx;
  memset(&cf_local,0,0x10);
  for (cfb = (Curl_cfilter *)0x0; cfb < *(Curl_cfilter **)(t._8_8_ + 0x98);
      cfb = (Curl_cfilter *)((long)&cfb->cft + 1)) {
    plVar1 = *(long **)(t._8_8_ + (long)cfb * 0x38 + 0x30);
    memset(&i,0,0x10);
    if ((((plVar1 != (long *)0x0) &&
         (iVar2 = (**(code **)(*plVar1 + 0x70))(plVar1,data,query,0,&i), iVar2 == 0)) &&
        ((i != 0 || ((int)t.tv_sec != 0)))) &&
       (newer.tv_usec = (int)t.tv_sec, newer.tv_sec = i, older.tv_usec = (int)tmax.tv_sec,
       older.tv_sec = (time_t)cf_local, older._12_4_ = 0, newer._12_4_ = 0,
       tVar3 = Curl_timediff_us(newer,older), 0 < tVar3)) {
      cf_local = (Curl_cfilter *)i;
      tmax.tv_sec._0_4_ = (int)t.tv_sec;
    }
  }
  cVar4.tv_usec = (int)tmax.tv_sec;
  cVar4.tv_sec = (time_t)cf_local;
  cVar4._12_4_ = 0;
  return cVar4;
}

Assistant:

static struct curltime cf_get_max_baller_time(struct Curl_cfilter *cf,
                                              struct Curl_easy *data,
                                              int query)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  struct curltime t, tmax;
  size_t i;

  memset(&tmax, 0, sizeof(tmax));
  for(i = 0; i < ctx->baller_count; i++) {
    struct Curl_cfilter *cfb = ctx->ballers[i].cf;
    memset(&t, 0, sizeof(t));
    if(cfb && !cfb->cft->query(cfb, data, query, NULL, &t)) {
      if((t.tv_sec || t.tv_usec) && Curl_timediff_us(t, tmax) > 0)
        tmax = t;
    }
  }
  return tmax;
}